

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O1

void __thiscall inja::FunctionNode::FunctionNode(FunctionNode *this,Op operation,size_t pos)

{
  ulong uVar1;
  Associativity AVar2;
  uint uVar3;
  
  (this->super_ExpressionNode).super_AstNode.pos = pos;
  (this->super_ExpressionNode).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_001b1bf8;
  this->operation = operation;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  AVar2 = Left;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->number_args = 1;
  (this->arguments).
  super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arguments).
  super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arguments).
  super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback).super__Function_base._M_functor + 8) = 0;
  (this->callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback)._M_invoker = (_Invoker_type)0x0;
  uVar3 = 1;
  if (operation < At) {
    uVar1 = (ulong)operation;
    uVar3 = *(uint *)(&DAT_00181448 + uVar1 * 4);
    AVar2 = *(Associativity *)(&DAT_0018148c + uVar1 * 4);
    this->number_args = *(int *)(&DAT_00181404 + uVar1 * 4);
  }
  this->precedence = uVar3;
  this->associativity = AVar2;
  return;
}

Assistant:

AstNode(size_t pos): pos(pos) {}